

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got::got(got *this,location *where_,text *expr_)

{
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  location local_a0;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  text *local_20;
  text *expr__local;
  location *where__local;
  got *this_local;
  
  local_20 = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"passed: got exception",&local_61);
  std::__cxx11::string::string(local_40,local_60);
  location::location(&local_a0,where_);
  std::__cxx11::string::string(local_c0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::__cxx11::string::string(local_e0,local_100);
  success::success(&this->super_success,(text *)local_40,&local_a0,(text *)local_c0,(text *)local_e0
                  );
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_c0);
  location::~location(&local_a0);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *(undefined ***)&(this->super_success).super_message = &PTR__got_001e0b70;
  return;
}

Assistant:

got( location where_, text expr_)
    : success( "passed: got exception", where_, expr_) {}